

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

void lvlfill_solid(level *lev,schar filling,schar lit)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  
  puVar3 = (uint *)&lev->locations[2][0].field_0x6;
  for (lVar2 = 2; lVar2 <= x_maze_max; lVar2 = lVar2 + 1) {
    puVar4 = puVar3;
    for (lVar5 = 0; lVar5 <= y_maze_max; lVar5 = lVar5 + 1) {
      if ((filling < '\'') && (*(schar *)((long)puVar4 + -2) = filling, filling == '\x15')) {
        *(byte *)((long)puVar4 + 1) = *(byte *)((long)puVar4 + 1) | 4;
      }
      else if (lit != -2) {
        if (lit == -1) {
          uVar1 = mt_random();
          *puVar4 = *puVar4 & 0xfffffbff | (uVar1 & 1) << 10;
        }
        else {
          *puVar4 = *puVar4 & 0xfffffbff | ((byte)lit & 1) << 10;
        }
      }
      puVar4 = puVar4 + 3;
    }
    puVar3 = puVar3 + 0x3f;
  }
  return;
}

Assistant:

static void lvlfill_solid(struct level *lev, schar filling, schar lit)
{
	int x, y;

	for (x = 2; x <= x_maze_max; x++) {
	    for (y = 0; y <= y_maze_max; y++) {
		SET_TYPLIT(lev, x, y, filling, lit);
	    }
	}
}